

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModulesC.cpp
# Opt level: O2

char * SoapySDR_getModuleVersion(char *path)

{
  char *pcVar1;
  allocator local_51;
  string local_50;
  string local_30;
  
  SoapySDRDevice_clearError();
  std::__cxx11::string::string((string *)&local_50,path,&local_51);
  SoapySDR::getModuleVersion(&local_30,&local_50);
  pcVar1 = toCString(&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  return pcVar1;
}

Assistant:

char *SoapySDR_getModuleVersion(const char *path)
{
    __SOAPY_SDR_C_TRY
    return toCString(SoapySDR::getModuleVersion(path));
    __SOAPY_SDR_C_CATCH_RET(nullptr);
}